

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O2

rb_tree_node_base *
nestl::impl::detail::rb_tree_decrement<nestl::impl::detail::rb_tree_node_base*>
          (rb_tree_node_base *x)

{
  rb_tree_node_base *prVar1;
  rb_tree_node_base *prVar2;
  bool bVar3;
  
  if ((x->m_color == rb_red) && (x->m_parent->m_parent == x)) {
    return x->m_right;
  }
  prVar1 = x->m_left;
  if (x->m_left == (rb_tree_node_base *)0x0) {
    do {
      prVar2 = x->m_parent;
      bVar3 = x == prVar2->m_left;
      x = prVar2;
    } while (bVar3);
  }
  else {
    do {
      prVar2 = prVar1;
      prVar1 = prVar2->m_right;
    } while (prVar2->m_right != (base_ptr)0x0);
  }
  return prVar2;
}

Assistant:

RbTreeNodeBasePtr rb_tree_decrement(RbTreeNodeBasePtr x) NESTL_NOEXCEPT_SPEC
{
    if (x->m_color == rb_red && x->m_parent->m_parent == x)
        x = x->m_right;
    else if (x->m_left != 0)
    {
        RbTreeNodeBasePtr y = x->m_left;
        while (y->m_right != 0)
            y = y->m_right;
        x = y;
    }
    else
    {
        RbTreeNodeBasePtr y = x->m_parent;
        while (x == y->m_left)
        {
            x = y;
            y = y->m_parent;
        }
        x = y;
    }
    return x;
}